

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_shared.h
# Opt level: O3

QString * escapeDependencyPath<QString>(QString *__return_storage_ptr__,QString *path)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  QChar ch;
  qsizetype alloc;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  uVar6 = (uint)(path->d).size;
  alloc = 0;
  if (0 < (long)(int)uVar6) {
    alloc = (long)(int)uVar6;
  }
  QString::reallocData(__return_storage_ptr__,alloc,KeepSize);
  pDVar2 = (__return_storage_ptr__->d).d;
  if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar2->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  if (0 < (int)uVar6) {
    lVar4 = 1;
    uVar5 = 0;
    do {
      ch.ucs = (path->d).ptr[uVar5];
      if (ch.ucs == L' ') {
        QString::append(__return_storage_ptr__,(QChar)0x5c);
        lVar3 = lVar4;
        if (1 < uVar5) {
          do {
            if ((path->d).ptr[(int)lVar3 - 2] != L'\\') break;
            QString::append(__return_storage_ptr__,(QChar)0x5c);
            lVar3 = lVar3 + -1;
          } while (2 < lVar3);
        }
      }
      else {
        if (ch.ucs != L'$') {
          if (ch.ucs != L'#') goto LAB_0011bfb4;
          ch.ucs = L'\\';
        }
        QString::append(__return_storage_ptr__,ch);
      }
LAB_0011bfb4:
      QString::append(__return_storage_ptr__,(QChar)(path->d).ptr[uVar5]);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 1;
    } while (uVar5 != (uVar6 & 0x7fffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

StringType escapeDependencyPath(const StringType &path)
{
    using CT = typename CharType<StringType>::type;
    StringType escapedPath;
    int size = path.size();
    escapedPath.reserve(size);
    for (int i = 0; i < size; ++i) {
        if (path[i] == CT('$')) {
            escapedPath.append(CT('$'));
        } else if (path[i] == CT('#')) {
            escapedPath.append(CT('\\'));
        } else if (path[i] == CT(' ')) {
            escapedPath.append(CT('\\'));
            int backwards_it = i - 1;
            while (backwards_it > 0 && path[backwards_it] == CT('\\')) {
                escapedPath.append(CT('\\'));
                --backwards_it;
            }
        }
        escapedPath.append(path[i]);
    }
    return escapedPath;
}